

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_edge_cases.cpp
# Opt level: O0

bool test_uintwide_t_edge::test_various_isolated_edge_cases(void)

{
  uniform_real_distribution<float> *this;
  value_type_conflict3 *this_00;
  bool bVar1;
  enable_if_t<std::is_integral<int>::value,_bool> eVar2;
  bool bVar3;
  unsigned_long *puVar4;
  pointer pvVar5;
  local_ctrl64_type *plVar6;
  unsigned_long uVar7;
  iterator puVar8;
  iterator puVar9;
  size_type sVar10;
  limb_type_conflict *plVar11;
  local_uintwide_t_small_unsigned_type *plVar12;
  local_uintwide_t_small_signed_type *plVar13;
  int in_R8D;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble lVar14;
  float fVar15;
  result_type_conflict1 rVar16;
  result_type_conflict1 rVar17;
  double dVar18;
  bool local_969;
  byte local_968;
  byte local_967;
  byte local_966;
  byte local_965;
  bool local_964;
  byte local_963;
  byte local_962;
  byte local_961;
  byte local_960;
  bool local_95f;
  enable_if_t<std::is_integral<int>::value,_bool> local_95e;
  bool local_95d;
  bool local_95c;
  bool local_95b;
  bool local_95a;
  bool local_959;
  bool local_958;
  bool local_957;
  bool local_956;
  bool local_955;
  enable_if_t<std::is_integral<int>::value,_bool> local_929;
  bool local_921;
  bool local_909;
  bool local_8fc;
  bool local_8fb;
  bool local_8f9;
  uintwide_t<256U,_unsigned_short,_void,_true> local_8f2;
  uintwide_t<256U,_unsigned_short,_void,_true> local_8d2;
  uintwide_t<256U,_unsigned_short,_void,_true> local_8b2;
  uintwide_t<256U,_unsigned_short,_void,_true> local_892;
  byte local_871;
  undefined1 auStack_870 [7];
  bool result_overshift_is_ok_1;
  value_type_conflict3 local_868 [4];
  value_type_conflict3 local_860 [4];
  value_type_conflict3 local_858 [4];
  undefined1 local_850 [8];
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
  n_right_u;
  undefined1 local_810 [8];
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_> n_right_n
  ;
  undefined1 local_7d0 [8];
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
  n_left_u;
  undefined1 local_790 [8];
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_> n_left_n;
  undefined1 auStack_768 [7];
  enable_if_t<std::is_integral<int>::value,_bool> n_is_neg;
  uintwide_t<256U,_unsigned_short,_void,_true> n_gen_1;
  uint shift_amount_1;
  uint i_7;
  value_type_conflict3 vStack_738;
  undefined1 local_71e [8];
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  u_right_u;
  undefined1 local_6de [8];
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  u_right_n;
  undefined1 local_69e [8];
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  u_left_u;
  undefined1 local_65e [8];
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_> u_left_n
  ;
  value_type_conflict3 vStack_636;
  bool result_overshift_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen_4;
  uint shift_amount;
  uint i_6;
  enable_if_t<std::is_integral<int>::value,_bool> local_609;
  uintwide_t<256U,_unsigned_short,_void,_false> *puStack_608;
  bool result_self_mod_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> *d;
  uintwide_t<256U,_unsigned_short,_void,_false> *c;
  local_uintwide_t_small_unsigned_type b;
  local_uintwide_t_small_unsigned_type a;
  local_uintwide_t_small_unsigned_type ten_pow_forty;
  bool result_zero_mod_with_finite_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> mod;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen_3;
  uint i_5;
  undefined1 auStack_52a [7];
  bool result_zero_div_by_zero_is_ok;
  local_uintwide_t_small_unsigned_type z;
  undefined1 local_4e8 [7];
  bool result_signed_div_by_zero_is_ok;
  undefined1 local_4c8 [8];
  local_uintwide_t_small_signed_type n_gen;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen_2;
  uint i_4;
  undefined1 local_460 [7];
  bool result_unsigned_div_by_zero_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen_1;
  uint i_3;
  undefined1 local_418 [7];
  bool result_overflow_is_ok_1;
  undefined1 local_3f8 [8];
  local_uintwide_t_small_unsigned_type u1_1;
  undefined1 local_3b6 [7];
  bool result_overflow_is_ok;
  undefined1 local_396 [8];
  local_uintwide_t_small_unsigned_type u1;
  bool result_right_is_ok_1;
  bool result_left_is_ok_1;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
  sl_ctrl;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_> sl_neg;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
  sr_ctrl;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_> sr_neg;
  uintwide_t<256U,_unsigned_short,_void,_true> s_gen;
  uint i_2;
  bool result_right_is_ok;
  bool result_left_is_ok;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  ul_ctrl;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_> ul_neg;
  enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
  ur_ctrl;
  enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_> ur_neg;
  uintwide_t<256U,_unsigned_short,_void,_false> u_gen;
  uint i_1;
  int local_220;
  undefined1 local_219;
  undefined1 local_218 [7];
  bool result_infinities_is_ok;
  local_uintwide_t_small_unsigned_type u_inf_ld;
  local_uintwide_t_small_unsigned_type u_inf_d;
  local_uintwide_t_small_unsigned_type u_inf_f;
  longdouble inf_ld;
  double inf_d;
  float inf_f;
  uniform_real_distribution<float> dis;
  uint i;
  uintwide_t<256U,_unsigned_short,_void,_false> local_170;
  undefined1 local_150;
  unsigned_short local_14e;
  undefined1 auStack_14c [4];
  bool rep_as_max3_is_ok;
  value_type_conflict3 vStack_146;
  value_type_conflict3 local_144 [4];
  value_type_conflict3 local_13c [4];
  value_type_conflict3 local_134 [4];
  uintwide_t<256U,_unsigned_short,_void,_false> local_12c;
  uintwide_t<256U,_unsigned_short,_void,_false> local_10c;
  undefined1 local_eb;
  unsigned_short local_ea;
  int local_e8;
  bool rep_as_max2_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> local_e2;
  undefined1 local_c1;
  unsigned_short local_c0;
  undefined1 local_be [5];
  enable_if_t<std::is_integral<int>::value,_bool> rep_as_zero_is_ok;
  uintwide_t<256U,_unsigned_short,_void,_false> local_9e;
  undefined1 local_7e;
  unsigned_short local_7c;
  undefined1 auStack_7a [4];
  bool rep_as_max_is_ok;
  value_type_conflict3 vStack_74;
  local_rep_type rep;
  bool result_op_is_ok;
  local_ctrl64_type c_ctrl;
  local_uint64_type c_uint;
  local_ctrl64_type b_ctrl;
  local_ctrl64_type a_ctrl;
  local_uint64_type b_uint;
  local_uint64_type a_uint;
  array<unsigned_char,_16UL> buffer;
  size_t max_size;
  bool result_is_ok;
  
  a_uint.values.super_array<unsigned_short,_4UL>.elems =
       (representation_type)(array<unsigned_short,_4UL>)0xff00000004000000;
  puVar4 = (unsigned_long *)
           std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)&a_uint);
  math::wide_integer::uintwide_t<64u,unsigned_short,void,false>::
  uintwide_t<unsigned_long>(unsigned_long,std::enable_if<(std::is_integral<unsigned_long>::
  value&&std::is_unsigned<unsigned_long>::value)&&((std::numeric_limits<unsigned_long>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (&b_uint,*puVar4,
             (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  pvVar5 = std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)&a_uint);
  math::wide_integer::uintwide_t<64u,unsigned_short,void,false>::
  uintwide_t<unsigned_long>(unsigned_long,std::enable_if<(std::is_integral<unsigned_long>::
  value&&std::is_unsigned<unsigned_long>::value)&&((std::numeric_limits<unsigned_long>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (&a_ctrl,*(unsigned_long *)(pvVar5 + 8),
             (enable_if_t<(std::is_integral<unsigned_long>::value_&&_std::is_unsigned<unsigned_long>::value_&&_(std::numeric_limits<unsigned_long>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  plVar6 = (local_ctrl64_type *)
           std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)&a_uint);
  b_ctrl = *plVar6;
  pvVar5 = std::array<unsigned_char,_16UL>::data((array<unsigned_char,_16UL> *)&a_uint);
  c_uint.values.super_array<unsigned_short,_4UL>.elems =
       *(representation_type *)((array<unsigned_short,_4UL> *)(pvVar5 + 8))->elems;
  bVar1 = math::wide_integer::uintwide_t<64U,_unsigned_short,_void,_false>::operator<
                    (&b_uint,(uintwide_t<64U,_unsigned_short,_void,_false> *)&a_ctrl);
  if (bVar1) {
    std::swap<math::wide_integer::uintwide_t<64u,unsigned_short,void,false>>
              (&b_uint,(uintwide_t<64U,_unsigned_short,_void,_false> *)&a_ctrl);
    std::swap<unsigned_long>(&b_ctrl,(unsigned_long *)&c_uint);
  }
  c_ctrl = (local_ctrl64_type)
           math::wide_integer::operator/
                     (&b_uint,(uintwide_t<64U,_unsigned_short,_void,_false> *)&a_ctrl);
  register0x00000000 = b_ctrl / (ulong)c_uint.values.super_array<unsigned_short,_4UL>.elems;
  uVar7 = math::wide_integer::uintwide_t::operator_cast_to_unsigned_long((uintwide_t *)&c_ctrl);
  bVar1 = uVar7 == stack0xffffffffffffffa8;
  bVar3 = stack0xffffffffffffffa8 == 0x54ffff;
  local_8f9 = bVar1 && bVar3;
  rep.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_8f9;
  local_7c = std::numeric_limits<unsigned_short>::max();
  math::wide_integer::detail::fixed_static_array<unsigned_short,_16U>::fixed_static_array
            ((fixed_static_array<unsigned_short,_16U> *)auStack_7a,0x10,&local_7c);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            (&local_9e,(representation_type *)auStack_7a);
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_false>::max();
  local_7e = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                       (&local_9e,(uintwide_t<256U,_unsigned_short,_void,_false> *)local_be);
  local_8fb = (bool)local_7e && (bVar1 && bVar3);
  puVar8 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::begin
                     ((array<unsigned_short,_16UL> *)auStack_7a);
  puVar9 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::end
                     ((array<unsigned_short,_16UL> *)auStack_7a);
  local_c0 = 0;
  std::fill<unsigned_short*,unsigned_short>(puVar8,puVar9,&local_c0);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            (&local_e2,(representation_type *)auStack_7a);
  local_e8 = 0;
  local_c1 = math::wide_integer::operator==(&local_e2,&local_e8);
  local_8fc = false;
  if ((bool)local_c1) {
    local_8fc = local_8fb;
  }
  puVar8 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::begin
                     ((array<unsigned_short,_16UL> *)auStack_7a);
  puVar9 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::end
                     ((array<unsigned_short,_16UL> *)auStack_7a);
  local_ea = std::numeric_limits<unsigned_short>::max();
  std::fill<unsigned_short*,unsigned_short>(puVar8,puVar9,&local_ea);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            (&local_10c,(representation_type *)auStack_7a);
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_false>::max();
  local_eb = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                       (&local_10c,&local_12c);
  local_909 = false;
  if ((bool)local_eb) {
    local_909 = local_8fc;
  }
  sVar10 = math::wide_integer::detail::array_detail::array<unsigned_short,_16UL>::size();
  local_14e = std::numeric_limits<unsigned_short>::max();
  math::wide_integer::detail::fixed_static_array<unsigned_short,_16U>::fixed_static_array
            ((fixed_static_array<unsigned_short,_16U> *)auStack_14c,sVar10 & 0xffffffff,&local_14e);
  auStack_7a._0_2_ = auStack_14c._0_2_;
  auStack_7a._2_2_ = auStack_14c._2_2_;
  _rep_as_max_is_ok = _rep_as_max3_is_ok;
  vStack_74 = vStack_146;
  rep.super_array<unsigned_short,_16UL>.elems[0] = local_144[0];
  rep.super_array<unsigned_short,_16UL>.elems[1] = local_144[1];
  rep.super_array<unsigned_short,_16UL>.elems[2] = local_144[2];
  rep.super_array<unsigned_short,_16UL>.elems[3] = local_144[3];
  rep.super_array<unsigned_short,_16UL>.elems[4] = local_13c[0];
  rep.super_array<unsigned_short,_16UL>.elems[5] = local_13c[1];
  rep.super_array<unsigned_short,_16UL>.elems[6] = local_13c[2];
  rep.super_array<unsigned_short,_16UL>.elems[7] = local_13c[3];
  rep.super_array<unsigned_short,_16UL>.elems[8] = local_134[0];
  rep.super_array<unsigned_short,_16UL>.elems[9] = local_134[1];
  rep.super_array<unsigned_short,_16UL>.elems[10] = local_134[2];
  rep.super_array<unsigned_short,_16UL>.elems[0xb] = local_134[3];
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            (&local_170,(representation_type *)auStack_7a);
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_false>::max();
  local_150 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                        (&local_170,
                         (uintwide_t<256U,_unsigned_short,_void,_false> *)&dis._M_param._M_b);
  local_921 = false;
  if ((bool)local_150) {
    local_921 = local_909;
  }
  max_size._7_1_ = local_921;
  for (dis._M_param._M_a = 0.0; (uint)dis._M_param._M_a < 0x10;
      dis._M_param._M_a = (float)((int)dis._M_param._M_a + 1)) {
    uVar7 = util::util_pseudorandom_time_point_seed::value<unsigned_long>();
    std::
    discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
    ::seed((discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
            *)eng_flt,uVar7);
    this = (uniform_real_distribution<float> *)((long)&inf_d + 4);
    std::uniform_real_distribution<float>::uniform_real_distribution(this,1.01,1.04);
    fVar15 = local_inf_f();
    rVar16 = std::uniform_real_distribution<float>::operator()
                       (this,(discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                              *)eng_flt);
    inf_d._0_4_ = fVar15 * rVar16;
    dVar18 = local_inf_d();
    rVar16 = std::uniform_real_distribution<float>::operator()
                       (this,(discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                              *)eng_flt);
    local_inf_ld();
    rVar17 = std::uniform_real_distribution<float>::operator()
                       (this,(discard_block_engine<std::subtract_with_carry_engine<unsigned_long,_48UL,_5UL,_12UL>,_389UL,_11UL>
                              *)eng_flt);
    lVar14 = in_ST6;
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<float,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (u_inf_d.values.super_array<unsigned_short,_16UL>.elems + 0xc),inf_d._0_4_);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t<double,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (u_inf_ld.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               dVar18 * (double)rVar16);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::
    uintwide_t<long_double,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_218,
               (longdouble)rVar17 * in_ST0);
    local_220 = 0;
    eVar2 = math::wide_integer::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (u_inf_d.values.super_array<unsigned_short,_16UL>.elems + 0xc),&local_220);
    local_929 = false;
    if (eVar2) {
      i_1 = 0;
      eVar2 = math::wide_integer::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                         (u_inf_ld.values.super_array<unsigned_short,_16UL>.elems + 0xc),(int *)&i_1
                        );
      local_929 = false;
      if (eVar2) {
        u_gen.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
        u_gen.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
        local_929 = math::wide_integer::operator==
                              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_218,
                               (int *)(u_gen.values.super_array<unsigned_short,_16UL>.elems + 0xe));
      }
    }
    local_219 = local_929;
    local_955 = false;
    if (local_929 != false) {
      local_955 = max_size._7_1_;
    }
    in_ST0 = in_ST1;
    in_ST1 = in_ST2;
    in_ST2 = in_ST3;
    in_ST3 = in_ST4;
    in_ST4 = in_ST5;
    in_ST5 = in_ST6;
    in_ST6 = lVar14;
    max_size._7_1_ = local_955;
  }
  u_gen.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  u_gen.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)u_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x100;
      u_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           u_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (ur_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    math::wide_integer::operator<<
              ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                *)(ur_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (ur_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),-4);
    math::wide_integer::operator>>
              ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                *)(ul_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (ur_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),4);
    math::wide_integer::operator>>
              ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                *)(ul_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (ur_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),-4);
    math::wide_integer::operator<<
              ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                *)&i_2,(uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (ur_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),4);
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (ul_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)&i_2);
    bVar3 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (ur_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (ul_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    local_956 = false;
    if ((bVar1) && (local_956 = false, bVar3)) {
      local_956 = max_size._7_1_;
    }
    max_size._7_1_ = local_956;
  }
  s_gen.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  s_gen.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)s_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x100;
      s_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           s_gen.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)
               (sr_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (test_uintwide_t_edge *)0x0,false,0x4c,in_R8D);
    math::wide_integer::operator<<
              ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                *)(sr_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (uintwide_t<256U,_unsigned_short,_void,_true> *)
               (sr_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),-4);
    math::wide_integer::operator>>
              ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                *)(sl_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (uintwide_t<256U,_unsigned_short,_void,_true> *)
               (sr_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),4);
    math::wide_integer::operator>>
              ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                *)(sl_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (uintwide_t<256U,_unsigned_short,_void,_true> *)
               (sr_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),-4);
    math::wide_integer::operator<<
              ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                *)(u1.values.super_array<unsigned_short,_16UL>.elems + 0xd),
               (uintwide_t<256U,_unsigned_short,_void,_true> *)
               (sr_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc),4);
    u1.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_true> *)
                    (sl_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                    (uintwide_t<256U,_unsigned_short,_void,_true> *)
                    (u1.values.super_array<unsigned_short,_16UL>.elems + 0xd));
    u1.values.super_array<unsigned_short,_16UL>.elems[0xc]._0_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_true> *)
                    (sr_ctrl.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                    (uintwide_t<256U,_unsigned_short,_void,_true> *)
                    (sl_neg.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    local_957 = false;
    if (((u1.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ & 1) != 0) &&
       (local_957 = false, (bool)(undefined1)u1.values.super_array<unsigned_short,_16UL>.elems[0xc])
       ) {
      local_957 = max_size._7_1_;
    }
    max_size._7_1_ = local_957;
  }
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (local_396,1,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  plVar11 = zero_as_limb();
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_short>(unsigned_short,std::enable_if<(std::is_integral<unsigned_short>::
  value&&std::is_unsigned<unsigned_short>::value)&&(std::numeric_limits<unsigned_short>::digits<=std
  ::numeric_limits<unsigned_short>::digits),void>::type__
            (local_3b6,*plVar11,
             (enable_if_t<(std::is_integral<unsigned_short>::value_&&_std::is_unsigned<unsigned_short>::value_&&_(std::numeric_limits<unsigned_short>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_396,
             (uintwide_t<256U,_unsigned_short,_void,_false> *)local_3b6);
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_false>::max();
  bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_396,
                     (uintwide_t<256U,_unsigned_short,_void,_false> *)
                     (u1_1.values.super_array<unsigned_short,_16UL>.elems + 0xc));
  local_958 = false;
  if (bVar1) {
    local_958 = max_size._7_1_;
  }
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_int>(unsigned_int,std::enable_if<(std::is_integral<unsigned_int>::value&&std::
  is_unsigned<unsigned_int>::value)&&((std::numeric_limits<unsigned_int>::digits>std::
  numeric_limits<unsigned_short>::digits)),void>::type__
            (local_3f8,1,
             (enable_if_t<(std::is_integral<unsigned_int>::value_&&_std::is_unsigned<unsigned_int>::value_&&_(std::numeric_limits<unsigned_int>::digits_>_std__numeric_limits<limb_type>__digits__>
              *)0x0);
  plVar11 = zero_as_limb();
  math::wide_integer::uintwide_t<256u,unsigned_short,void,false>::
  uintwide_t<unsigned_short>(unsigned_short,std::enable_if<(std::is_integral<unsigned_short>::
  value&&std::is_unsigned<unsigned_short>::value)&&(std::numeric_limits<unsigned_short>::digits<=std
  ::numeric_limits<unsigned_short>::digits),void>::type__
            (local_418,*plVar11,
             (enable_if_t<(std::is_integral<unsigned_short>::value_&&_std::is_unsigned<unsigned_short>::value_&&_(std::numeric_limits<unsigned_short>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_3f8,
             (uintwide_t<256U,_unsigned_short,_void,_false> *)local_418);
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_false>::max();
  bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_3f8,
                     (uintwide_t<256U,_unsigned_short,_void,_false> *)
                     (u_gen_1.values.super_array<unsigned_short,_16UL>.elems + 0xf));
  local_959 = false;
  if (bVar1) {
    local_959 = local_958;
  }
  u_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  u_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  max_size._7_1_ = local_959;
  for (; (uint)u_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x100;
      u_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           u_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_460,
               (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    plVar12 = zero_as_small_unsigned_type();
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_460,plVar12);
    math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_false>::max();
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_460,
                       (uintwide_t<256U,_unsigned_short,_void,_false> *)
                       (u_gen_2.values.super_array<unsigned_short,_16UL>.elems + 0xf));
    local_95a = false;
    if (bVar1) {
      local_95a = max_size._7_1_;
    }
    max_size._7_1_ = local_95a;
  }
  u_gen_2.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  u_gen_2.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)u_gen_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x100;
      u_gen_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           u_gen_2.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (n_gen.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_4c8,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (n_gen.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    plVar12 = zero_as_small_unsigned_type();
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<false,_nullptr>
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_4e8,plVar12);
    math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator/=
              ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_4c8,
               (uintwide_t<256U,_unsigned_short,_void,_true> *)local_4e8);
    math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_true>::max();
    bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                      ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_4c8,
                       (uintwide_t<256U,_unsigned_short,_void,_true> *)
                       (z.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    local_95b = false;
    if (bVar1) {
      local_95b = max_size._7_1_;
    }
    max_size._7_1_ = local_95b;
  }
  plVar12 = zero_as_small_unsigned_type();
  _auStack_52a = *(undefined8 *)(plVar12->values).super_array<unsigned_short,_16UL>.elems;
  z.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
       *(undefined8 *)((plVar12->values).super_array<unsigned_short,_16UL>.elems + 4);
  z.values.super_array<unsigned_short,_16UL>.elems._8_8_ =
       *(undefined8 *)((plVar12->values).super_array<unsigned_short,_16UL>.elems + 8);
  z.values.super_array<unsigned_short,_16UL>.elems._16_8_ =
       *(undefined8 *)((plVar12->values).super_array<unsigned_short,_16UL>.elems + 0xc);
  plVar12 = zero_as_small_unsigned_type();
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator/=
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)auStack_52a,plVar12);
  math::wide_integer::numeric_limits_uintwide_t_base<256U,_unsigned_short,_void,_false>::max();
  bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                    ((uintwide_t<256U,_unsigned_short,_void,_false> *)auStack_52a,
                     (uintwide_t<256U,_unsigned_short,_void,_false> *)
                     (u_gen_3.values.super_array<unsigned_short,_16UL>.elems + 0xe));
  local_95c = false;
  if (bVar1) {
    local_95c = max_size._7_1_;
  }
  u_gen_3.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
  u_gen_3.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
  for (; (uint)u_gen_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 0x100;
      u_gen_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
           u_gen_3.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 1) {
    generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (mod.values.super_array<unsigned_short,_16UL>.elems + 0xc),
               (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
    plVar12 = zero_as_small_unsigned_type();
    math::wide_integer::operator%
              ((uintwide_t<256U,_unsigned_short,_void,_false> *)
               (ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems + 0xd),plVar12,
               (uintwide_t<256U,_unsigned_short,_void,_false> *)
               (mod.values.super_array<unsigned_short,_16UL>.elems + 0xc));
    plVar12 = zero_as_small_unsigned_type();
    ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ =
         math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                   ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                    (ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems + 0xd),plVar12);
    local_95d = false;
    if ((bool)ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_) {
      local_95d = local_95c;
    }
    local_95c = local_95d;
  }
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)
             (a.values.super_array<unsigned_short,_16UL>.elems + 0xc),
             "10000000000000000000000000000000000000000");
  b.values.super_array<unsigned_short,_16UL>.elems[0xc] =
       a.values.super_array<unsigned_short,_16UL>.elems[0xc];
  b.values.super_array<unsigned_short,_16UL>.elems[0xd] =
       a.values.super_array<unsigned_short,_16UL>.elems[0xd];
  b.values.super_array<unsigned_short,_16UL>.elems[0xe] =
       a.values.super_array<unsigned_short,_16UL>.elems[0xe];
  b.values.super_array<unsigned_short,_16UL>.elems[0xf] =
       a.values.super_array<unsigned_short,_16UL>.elems[0xf];
  a.values.super_array<unsigned_short,_16UL>.elems[0] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[0];
  a.values.super_array<unsigned_short,_16UL>.elems[1] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[1];
  a.values.super_array<unsigned_short,_16UL>.elems[2] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[2];
  a.values.super_array<unsigned_short,_16UL>.elems[3] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[3];
  a.values.super_array<unsigned_short,_16UL>.elems[4] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[4];
  a.values.super_array<unsigned_short,_16UL>.elems[5] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[5];
  a.values.super_array<unsigned_short,_16UL>.elems[6] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[6];
  a.values.super_array<unsigned_short,_16UL>.elems[7] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[7];
  a.values.super_array<unsigned_short,_16UL>.elems[8] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[8];
  a.values.super_array<unsigned_short,_16UL>.elems[9] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[9];
  a.values.super_array<unsigned_short,_16UL>.elems[10] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[10];
  a.values.super_array<unsigned_short,_16UL>.elems[0xb] =
       ten_pow_forty.values.super_array<unsigned_short,_16UL>.elems[0xb];
  math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::uintwide_t
            ((uintwide_t<256U,_unsigned_short,_void,_false> *)((long)&c + 6),
             "10000000000000000000000000000000000000000");
  d = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator%=
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                 (b.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)((long)&c + 6));
  this_00 = b.values.super_array<unsigned_short,_16UL>.elems + 0xc;
  puStack_608 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator%=
                          ((uintwide_t<256U,_unsigned_short,_void,_false> *)this_00,
                           (uintwide_t<256U,_unsigned_short,_void,_false> *)this_00);
  i_6 = 0;
  eVar2 = math::wide_integer::operator==(d,(int *)&i_6);
  local_95e = false;
  if (eVar2) {
    shift_amount = 0;
    local_95e = math::wide_integer::operator==(puStack_608,(int *)&shift_amount);
  }
  local_609 = local_95e;
  local_95f = false;
  if (local_95e != false) {
    local_95f = local_95c;
  }
  max_size._7_1_ = local_95f;
  u_gen_4.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  u_gen_4.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  for (; (uint)u_gen_4.values.super_array<unsigned_short,_16UL>.elems._28_4_ < 0x100;
      u_gen_4.values.super_array<unsigned_short,_16UL>.elems._28_4_ =
           u_gen_4.values.super_array<unsigned_short,_16UL>.elems._28_4_ + 1) {
    u_gen_4.values.super_array<unsigned_short,_16UL>.elems[0xc] = 300;
    u_gen_4.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    for (; (uint)u_gen_4.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 2000;
        u_gen_4.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
             u_gen_4.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 100) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,false>>
                ((uintwide_t<256U,_unsigned_short,_void,_false> *)
                 (u_left_n.values.super_array<unsigned_short,_16UL>.elems + 0xd),
                 (test_uintwide_t_edge *)0x1,false,0x4d,in_R8D);
      u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = 1;
      u_left_u.values.super_array<unsigned_short,_16UL>.elems[0xc] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xd];
      u_left_u.values.super_array<unsigned_short,_16UL>.elems[0xd] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xe];
      u_left_u.values.super_array<unsigned_short,_16UL>.elems[0xe] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xf];
      u_left_u.values.super_array<unsigned_short,_16UL>.elems[0xf] = vStack_636;
      math::wide_integer::operator<<
                ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                  *)local_65e,
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)
                 (u_left_u.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 u_gen_4.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      u_right_n.values.super_array<unsigned_short,_16UL>.elems[0xc] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xd];
      u_right_n.values.super_array<unsigned_short,_16UL>.elems[0xd] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xe];
      u_right_n.values.super_array<unsigned_short,_16UL>.elems[0xe] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xf];
      u_right_n.values.super_array<unsigned_short,_16UL>.elems[0xf] = vStack_636;
      math::wide_integer::operator<<
                ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                  *)local_69e,
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)
                 (u_right_n.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 u_gen_4.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      u_right_u.values.super_array<unsigned_short,_16UL>.elems[0xc] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xd];
      u_right_u.values.super_array<unsigned_short,_16UL>.elems[0xd] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xe];
      u_right_u.values.super_array<unsigned_short,_16UL>.elems[0xe] =
           u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xf];
      u_right_u.values.super_array<unsigned_short,_16UL>.elems[0xf] = vStack_636;
      math::wide_integer::operator>>
                ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                  *)local_6de,
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)
                 (u_right_u.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 u_gen_4.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      shift_amount_1._2_2_ = u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xd];
      i_7._0_2_ = u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xe];
      i_7._2_2_ = u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xf];
      vStack_738 = vStack_636;
      math::wide_integer::operator>>
                ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_false>_>
                  *)local_71e,
                 (uintwide_t<256U,_unsigned_short,_void,_false> *)((long)&shift_amount_1 + 2),
                 u_gen_4.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      plVar12 = zero_as_small_unsigned_type();
      bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_65e,plVar12);
      local_960 = 0;
      if (bVar1) {
        local_960 = u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
      }
      u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_960 & 1;
      plVar12 = zero_as_small_unsigned_type();
      bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_69e,plVar12);
      local_961 = 0;
      if (bVar1) {
        local_961 = u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
      }
      u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_961 & 1;
      plVar12 = zero_as_small_unsigned_type();
      bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_6de,plVar12);
      local_962 = 0;
      if (bVar1) {
        local_962 = u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
      }
      u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_962 & 1;
      plVar12 = zero_as_small_unsigned_type();
      bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_false>::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_false> *)local_71e,plVar12);
      local_963 = 0;
      if (bVar1) {
        local_963 = u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_;
      }
      u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ = local_963 & 1;
      local_964 = false;
      if (u_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc]._1_1_ != 0) {
        local_964 = max_size._7_1_;
      }
      max_size._7_1_ = local_964;
    }
  }
  n_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xe] = 0;
  n_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xf] = 0;
  for (; (uint)n_gen_1.values.super_array<unsigned_short,_16UL>.elems._28_4_ < 0x100;
      n_gen_1.values.super_array<unsigned_short,_16UL>.elems._28_4_ =
           n_gen_1.values.super_array<unsigned_short,_16UL>.elems._28_4_ + 1) {
    n_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xc] = 300;
    n_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
    for (; (uint)n_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ < 2000;
        n_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ =
             n_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_ + 100) {
      generate_wide_integer_value<math::wide_integer::uintwide_t<256u,unsigned_short,void,true>>
                ((uintwide_t<256U,_unsigned_short,_void,_true> *)auStack_768,
                 (test_uintwide_t_edge *)0x0,false,0x4c,in_R8D);
      n_left_n.values.super_array<unsigned_short,_16UL>.elems[0xc] = 0;
      n_left_n.values.super_array<unsigned_short,_16UL>.elems[0xd] = 0;
      n_left_n.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_ =
           math::wide_integer::operator<
                     ((uintwide_t<256U,_unsigned_short,_void,_true> *)auStack_768,
                      (int *)(n_left_n.values.super_array<unsigned_short,_16UL>.elems + 0xc));
      n_left_u.values.super_array<unsigned_short,_16UL>.elems[0xc] = auStack_768._0_2_;
      n_left_u.values.super_array<unsigned_short,_16UL>.elems[0xd] = auStack_768._2_2_;
      n_left_u.values.super_array<unsigned_short,_16UL>.elems[0xe] = auStack_768._4_2_;
      n_left_u.values.super_array<unsigned_short,_16UL>.elems[0xf] = stack0xfffffffffffff89e;
      math::wide_integer::operator<<
                ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                  *)local_790,
                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                 (n_left_u.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 n_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      n_right_n.values.super_array<unsigned_short,_16UL>.elems[0xc] = auStack_768._0_2_;
      n_right_n.values.super_array<unsigned_short,_16UL>.elems[0xd] = auStack_768._2_2_;
      n_right_n.values.super_array<unsigned_short,_16UL>.elems[0xe] = auStack_768._4_2_;
      n_right_n.values.super_array<unsigned_short,_16UL>.elems[0xf] = stack0xfffffffffffff89e;
      math::wide_integer::operator<<
                ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                  *)local_7d0,
                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                 (n_right_n.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 n_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      n_right_u.values.super_array<unsigned_short,_16UL>.elems[0xc] = auStack_768._0_2_;
      n_right_u.values.super_array<unsigned_short,_16UL>.elems[0xd] = auStack_768._2_2_;
      n_right_u.values.super_array<unsigned_short,_16UL>.elems[0xe] = auStack_768._4_2_;
      n_right_u.values.super_array<unsigned_short,_16UL>.elems[0xf] = stack0xfffffffffffff89e;
      math::wide_integer::operator>>
                ((enable_if_t<std::is_integral<int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                  *)local_810,
                 (uintwide_t<256U,_unsigned_short,_void,_true> *)
                 (n_right_u.values.super_array<unsigned_short,_16UL>.elems + 0xc),
                 n_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      auStack_870._0_2_ = auStack_768._0_2_;
      auStack_870._2_2_ = auStack_768._2_2_;
      auStack_870._4_2_ = auStack_768._4_2_;
      stack0xfffffffffffff796 = stack0xfffffffffffff89e;
      local_868[0] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[0];
      local_868[1] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[1];
      local_868[2] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[2];
      local_868[3] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[3];
      local_860[0] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[4];
      local_860[1] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[5];
      local_860[2] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[6];
      local_860[3] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[7];
      local_858[0] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[8];
      local_858[1] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[9];
      local_858[2] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[10];
      local_858[3] = n_gen_1.values.super_array<unsigned_short,_16UL>.elems[0xb];
      math::wide_integer::operator>>
                ((enable_if_t<std::is_integral<unsigned_int>::value,_uintwide_t<256U,_unsigned_short,_void,_true>_>
                  *)local_850,(uintwide_t<256U,_unsigned_short,_void,_true> *)auStack_870,
                 n_gen_1.values.super_array<unsigned_short,_16UL>.elems._24_4_);
      local_871 = 1;
      plVar12 = zero_as_small_unsigned_type();
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<false,_nullptr>
                (&local_892,plVar12);
      bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_790,&local_892);
      local_965 = 0;
      if (bVar1) {
        local_965 = local_871;
      }
      local_871 = local_965 & 1;
      plVar12 = zero_as_small_unsigned_type();
      math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<false,_nullptr>
                (&local_8b2,plVar12);
      bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_7d0,&local_8b2);
      local_966 = 0;
      if (bVar1) {
        local_966 = local_871;
      }
      local_871 = local_966 & 1;
      if ((n_left_n.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_ & 1) == 0) {
        plVar12 = zero_as_small_unsigned_type();
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<false,_nullptr>
                  (&local_8d2,plVar12);
      }
      else {
        plVar13 = m_one_as_small_signed_type();
        local_8d2.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
             *(undefined8 *)(plVar13->values).super_array<unsigned_short,_16UL>.elems;
        local_8d2.values.super_array<unsigned_short,_16UL>.elems._8_8_ =
             *(undefined8 *)((plVar13->values).super_array<unsigned_short,_16UL>.elems + 4);
        local_8d2.values.super_array<unsigned_short,_16UL>.elems._16_8_ =
             *(undefined8 *)((plVar13->values).super_array<unsigned_short,_16UL>.elems + 8);
        local_8d2.values.super_array<unsigned_short,_16UL>.elems._24_8_ =
             *(undefined8 *)((plVar13->values).super_array<unsigned_short,_16UL>.elems + 0xc);
      }
      bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_810,&local_8d2);
      local_967 = 0;
      if (bVar1) {
        local_967 = local_871;
      }
      local_871 = local_967 & 1;
      if ((n_left_n.values.super_array<unsigned_short,_16UL>.elems[0xf]._1_1_ & 1) == 0) {
        plVar12 = zero_as_small_unsigned_type();
        math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::uintwide_t<false,_nullptr>
                  (&local_8f2,plVar12);
      }
      else {
        plVar13 = m_one_as_small_signed_type();
        local_8f2.values.super_array<unsigned_short,_16UL>.elems._0_8_ =
             *(undefined8 *)(plVar13->values).super_array<unsigned_short,_16UL>.elems;
        local_8f2.values.super_array<unsigned_short,_16UL>.elems._8_8_ =
             *(undefined8 *)((plVar13->values).super_array<unsigned_short,_16UL>.elems + 4);
        local_8f2.values.super_array<unsigned_short,_16UL>.elems._16_8_ =
             *(undefined8 *)((plVar13->values).super_array<unsigned_short,_16UL>.elems + 8);
        local_8f2.values.super_array<unsigned_short,_16UL>.elems._24_8_ =
             *(undefined8 *)((plVar13->values).super_array<unsigned_short,_16UL>.elems + 0xc);
      }
      bVar1 = math::wide_integer::uintwide_t<256U,_unsigned_short,_void,_true>::operator==
                        ((uintwide_t<256U,_unsigned_short,_void,_true> *)local_850,&local_8f2);
      local_968 = 0;
      if (bVar1) {
        local_968 = local_871;
      }
      local_871 = local_968 & 1;
      local_969 = false;
      if (local_871 != 0) {
        local_969 = max_size._7_1_;
      }
      max_size._7_1_ = local_969;
    }
  }
  return max_size._7_1_;
}

Assistant:

auto test_various_isolated_edge_cases() -> bool // NOLINT(readability-function-cognitive-complexity)
{
  auto result_is_ok = true;

  {
    // See also bug report in legacy project long_long_long
    // https://github.com/ckormanyos/long_long_long/issues/11

    using local_uint64_type = local_uintwide_t_tiny_unsigned_type;
    using local_ctrl64_type = std::uint64_t;

    constexpr std::size_t
      max_size
      {
        static_cast<std::size_t>
        (
          std::numeric_limits<local_uint64_type>::digits / 8
        )
      };

    std::array<std::uint8_t, std::size_t { UINT8_C(16) }>
      buffer
      {
        0x00U, 0x00U, 0x00U, 0x04U, 0x00U, 0x00U, 0x00U, 0xFFU, // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
        0x0FU, 0x00U, 0x00U, 0x00U, 0x00U, 0x03U, 0x00U, 0x00U  // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      };

    local_uint64_type a_uint { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 0U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)
    local_uint64_type b_uint { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 1U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)

    local_ctrl64_type a_ctrl { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 0U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)
    local_ctrl64_type b_ctrl { *reinterpret_cast<std::uint64_t*>(buffer.data() + std::size_t { 1U * max_size }) }; // NOLINT(cppcoreguidelines-pro-type-reinterpret-cast)

    if(a_uint < b_uint)
    {
      std::swap(a_uint, b_uint);
      std::swap(a_ctrl, b_ctrl);
    }

    const local_uint64_type c_uint = a_uint / b_uint;
    const local_ctrl64_type c_ctrl = a_ctrl / b_ctrl;

    const bool
      result_op_is_ok
      {
           (static_cast<std::uint64_t>(c_uint) == c_ctrl)
        && (UINT64_C(0x000000000054FFFF) == c_ctrl)
      };

    result_is_ok = (result_op_is_ok && result_is_ok);
  }

  {
    using local_rep_type   = typename local_uintwide_t_small_unsigned_type::representation_type;
    using local_value_type = typename local_rep_type::value_type;

    local_rep_type
      rep
      (
        local_uintwide_t_small_unsigned_type::number_of_limbs,
        (std::numeric_limits<local_value_type>::max)(),
        typename local_rep_type::allocator_type()
      );

    const auto rep_as_max_is_ok =
      (local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (rep_as_max_is_ok && result_is_ok);

    std::fill(rep.begin(), rep.end(), static_cast<local_value_type>(UINT8_C(0)));

    const auto rep_as_zero_is_ok = (local_uintwide_t_small_unsigned_type(rep) == 0);

    result_is_ok = (rep_as_zero_is_ok && result_is_ok);

    std::fill(rep.begin(), rep.end(), (std::numeric_limits<local_value_type>::max)());

    const auto rep_as_max2_is_ok =
      (local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (rep_as_max2_is_ok && result_is_ok);

    rep =
      local_rep_type
      (
        static_cast<typename local_rep_type::size_type>(rep.size()), // NOLINT(readability-static-accessed-through-instance)
        (std::numeric_limits<local_value_type>::max)(),
        typename local_rep_type::allocator_type()
      );

    const auto rep_as_max3_is_ok =
    (
      local_uintwide_t_small_unsigned_type(rep) == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)()
    );

    result_is_ok = (rep_as_max3_is_ok && result_is_ok);
  }


  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(UINT8_C(16));
           ++i)
  {
    eng_flt.seed(util::util_pseudorandom_time_point_seed::value<typename eng_flt_type::result_type>());

    auto dis =
      std::uniform_real_distribution<float>
      {
        static_cast<float>(1.01F), // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
        static_cast<float>(1.04F)  // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      };

    const auto inf_f  = ::local_inf_f () * dis(eng_flt);
    const auto inf_d  = ::local_inf_d () * static_cast<double>(dis(eng_flt));
    const auto inf_ld = ::local_inf_ld() * static_cast<long double>(dis(eng_flt));

    local_uintwide_t_small_unsigned_type u_inf_f (inf_f);
    local_uintwide_t_small_unsigned_type u_inf_d (inf_d);
    local_uintwide_t_small_unsigned_type u_inf_ld(inf_ld);

    const auto result_infinities_is_ok = (   (u_inf_f  == 0)
                                          && (u_inf_d  == 0)
                                          && (u_inf_ld == 0));

    result_is_ok = (result_infinities_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify shift of an unsigned wide-integer by a signed amount.

    const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    const auto ur_neg  = u_gen << static_cast<int>(INT8_C(-4));
    const auto ur_ctrl = u_gen >> static_cast<unsigned>(UINT8_C(4));

    const auto ul_neg  = u_gen >> static_cast<int>(INT8_C(-4));
    const auto ul_ctrl = u_gen << static_cast<unsigned>(UINT8_C(4));

    const auto result_left_is_ok  = (ul_neg == ul_ctrl);
    const auto result_right_is_ok = (ur_neg == ur_ctrl);

    result_is_ok = (result_left_is_ok && result_right_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify shift of a signed wide-integer by a signed amount.

    const auto s_gen = generate_wide_integer_value<local_uintwide_t_small_signed_type>(false);

    const auto sr_neg  = s_gen << static_cast<int>(INT8_C(-4));
    const auto sr_ctrl = s_gen >> static_cast<unsigned>(UINT8_C(4));

    const auto sl_neg  = s_gen >> static_cast<int>(INT8_C(-4));
    const auto sl_ctrl = s_gen << static_cast<unsigned>(UINT8_C(4));

    const auto result_left_is_ok  = (sl_neg == sl_ctrl);
    const auto result_right_is_ok = (sr_neg == sr_ctrl);

    result_is_ok = (result_left_is_ok && result_right_is_ok && result_is_ok);
  }

  {
    local_uintwide_t_small_unsigned_type u1(static_cast<unsigned>(UINT8_C(1)));

    u1 /= zero_as_limb();

    const auto result_overflow_is_ok = (u1 == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_overflow_is_ok && result_is_ok);
  }

  {
    local_uintwide_t_small_unsigned_type u1(static_cast<unsigned>(UINT8_C(1)));

    u1 /= local_uintwide_t_small_unsigned_type(zero_as_limb());

    const auto result_overflow_is_ok = (u1 == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_overflow_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify division of finite, unsigned numerator by zero which returns the maximum of the type.

    auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    u_gen /= zero_as_small_unsigned_type();

    const auto result_unsigned_div_by_zero_is_ok = (u_gen == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_unsigned_div_by_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify division of finite, signed numerator by zero which returns the maximum of the type.

    const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();
    auto n_gen = local_uintwide_t_small_signed_type(u_gen);

    n_gen /= local_uintwide_t_small_signed_type(zero_as_small_unsigned_type());

    const auto result_signed_div_by_zero_is_ok = (n_gen == (std::numeric_limits<local_uintwide_t_small_signed_type>::max)());

    result_is_ok = (result_signed_div_by_zero_is_ok && result_is_ok);
  }

  {
    // Verify division of zero by zero which returns the maximum of the type.

    auto z = zero_as_small_unsigned_type();

    z /= zero_as_small_unsigned_type();

    const auto result_zero_div_by_zero_is_ok = (z == (std::numeric_limits<local_uintwide_t_small_unsigned_type>::max)());

    result_is_ok = (result_zero_div_by_zero_is_ok && result_is_ok);
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    // Verify modulus of zero with a finite denominator which returns zero modulus.

    auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

    const auto mod = zero_as_small_unsigned_type() % u_gen;

    const auto result_zero_mod_with_finite_is_ok = (mod == zero_as_small_unsigned_type());

    result_is_ok = (result_zero_mod_with_finite_is_ok && result_is_ok);
  }

  {
    const auto ten_pow_forty = local_uintwide_t_small_unsigned_type("10000000000000000000000000000000000000000");

          auto a(ten_pow_forty);
    const auto b(local_uintwide_t_small_unsigned_type("10000000000000000000000000000000000000000"));

    const auto& c(a %= b);

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wself-assign-overloaded"
    #endif

    const auto& d(a %= a); // NOLINT(clang-diagnostic-self-assign-overloaded)

    #if (defined(__clang__) && (defined(__clang_major__) && (__clang_major__ > 6)))
    #pragma GCC diagnostic pop
    #endif

    const auto result_self_mod_is_ok = ((c == 0) && (d == 0));

    result_is_ok = (result_self_mod_is_ok && result_is_ok);
  }


  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    auto shift_amount = // NOLINT(altera-id-dependent-backward-branch)
      static_cast<unsigned>
      (
          static_cast<int>
          (
                (std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits / static_cast<int>(INT8_C(100)))
            + (((std::numeric_limits<local_uintwide_t_small_unsigned_type>::digits % static_cast<int>(INT8_C(100))) != 0) ? 1 : 0)
          )
        *
          static_cast<int>(INT8_C(100))
      );

    for( ; shift_amount  < static_cast<unsigned>(UINT32_C(2000)); // NOLINT(altera-id-dependent-backward-branch)
           shift_amount += static_cast<unsigned>(UINT32_C(100)))
    {
      const auto u_gen = generate_wide_integer_value<local_uintwide_t_small_unsigned_type>();

      auto result_overshift_is_ok = true;

      const auto u_left_n  = local_uintwide_t_small_unsigned_type(u_gen) << static_cast<std::int32_t> (shift_amount);
      const auto u_left_u  = local_uintwide_t_small_unsigned_type(u_gen) << static_cast<std::uint32_t>(shift_amount);
      const auto u_right_n = local_uintwide_t_small_unsigned_type(u_gen) >> static_cast<std::int32_t> (shift_amount);
      const auto u_right_u = local_uintwide_t_small_unsigned_type(u_gen) >> static_cast<std::uint32_t>(shift_amount);

      result_overshift_is_ok = ((u_left_n  == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_left_u  == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_right_n == zero_as_small_unsigned_type()) && result_overshift_is_ok);
      result_overshift_is_ok = ((u_right_u == zero_as_small_unsigned_type()) && result_overshift_is_ok);

      result_is_ok = (result_overshift_is_ok && result_is_ok);
    }
  }

  for(auto   i = static_cast<unsigned>(UINT8_C(0));
             i < static_cast<unsigned>(loop_count_hi);
           ++i)
  {
    auto shift_amount =
      static_cast<unsigned>
      (
          (
                (std::numeric_limits<local_uintwide_t_small_signed_type>::digits / 100)                // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
            + (((std::numeric_limits<local_uintwide_t_small_signed_type>::digits % 100) != 0) ? 1 : 0) // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
          )
        *
          100 // NOLINT(cppcoreguidelines-avoid-magic-numbers,readability-magic-numbers)
      );

    for( ; shift_amount  < static_cast<unsigned>(UINT32_C(2000)); // NOLINT(altera-id-dependent-backward-branch)
           shift_amount += static_cast<unsigned>(UINT32_C(100)))
    {
      const auto n_gen = generate_wide_integer_value<local_uintwide_t_small_signed_type>(false);

      const auto n_is_neg = (n_gen < 0);

      const auto n_left_n  = local_uintwide_t_small_signed_type(n_gen) << static_cast<std::int32_t> (shift_amount);
      const auto n_left_u  = local_uintwide_t_small_signed_type(n_gen) << static_cast<std::uint32_t>(shift_amount);
      const auto n_right_n = local_uintwide_t_small_signed_type(n_gen) >> static_cast<std::int32_t> (shift_amount);
      const auto n_right_u = local_uintwide_t_small_signed_type(n_gen) >> static_cast<std::uint32_t>(shift_amount);

      auto result_overshift_is_ok = true;

      result_overshift_is_ok = ((n_left_n  == local_uintwide_t_small_signed_type(zero_as_small_unsigned_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_left_u  == local_uintwide_t_small_signed_type(zero_as_small_unsigned_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_right_n == ((!n_is_neg) ? local_uintwide_t_small_signed_type(zero_as_small_unsigned_type()) : m_one_as_small_signed_type())) && result_overshift_is_ok);
      result_overshift_is_ok = ((n_right_u == ((!n_is_neg) ? local_uintwide_t_small_signed_type(zero_as_small_unsigned_type()) : m_one_as_small_signed_type())) && result_overshift_is_ok);

      result_is_ok = (result_overshift_is_ok && result_is_ok);
    }
  }

  return result_is_ok;
}